

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpl.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *__s;
  int iVar1;
  ostream *poVar2;
  pointer pAVar3;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  istreambuf_iterator<char,_std::char_traits<char>_> __last;
  exception *ex;
  Scope scope;
  NodePtr expr;
  Parser parser;
  ofstream asm_out;
  allocator<char> local_291;
  string local_290 [8];
  string out_fname;
  undefined4 local_268;
  undefined1 local_260 [2] [12];
  istream_type local_240 [8];
  ifstream fin;
  string local_38 [8];
  string expression;
  char **argv_local;
  int argc_local;
  
  expression.field_2._8_8_ = argv;
  std::__cxx11::string::string(local_38);
  if (1 < argc) {
    iVar1 = strcmp(*(char **)(expression.field_2._8_8_ + 8),"-");
    if (iVar1 != 0) {
      std::ifstream::ifstream(local_240,*(undefined8 *)(expression.field_2._8_8_ + 8),8);
      std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
                ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_260,local_240);
      std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
                ((istreambuf_iterator<char,_std::char_traits<char>_> *)
                 ((long)&out_fname.field_2 + 8));
      __first._12_4_ = 0;
      __first._M_sbuf = (streambuf_type *)local_260[0]._0_8_;
      __first._M_c = local_260[0]._8_4_;
      __last._12_4_ = 0;
      __last._M_sbuf = (streambuf_type *)out_fname.field_2._8_8_;
      __last._M_c = local_268;
      std::__cxx11::string::assign<std::istreambuf_iterator<char,std::char_traits<char>>,void>
                (local_38,__first,__last);
      std::ifstream::~ifstream(local_240);
      goto LAB_0010aa75;
    }
  }
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&std::cin,local_38);
LAB_0010aa75:
  poVar2 = std::operator<<((ostream *)&std::cerr,"Input:\n");
  poVar2 = std::operator<<(poVar2,local_38);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  __s = *(char **)(expression.field_2._8_8_ + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_290,__s,&local_291);
  std::allocator<char>::~allocator(&local_291);
  std::__cxx11::string::operator+=(local_290,".vasm");
  std::ofstream::ofstream(&parser.pos_,local_290,0x10);
  VPLGrammar::Parser::Parser((Parser *)&expr);
  VPLGrammar::Parser::Parse((Parser *)&scope.out_,(string *)&expr);
  pAVar3 = std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
           ::operator->((unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
                         *)&scope.out_);
  (*pAVar3->_vptr_ASTNodeBasic[4])(pAVar3,&std::cout);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  vpl::Scope::Scope((Scope *)&ex,(ostream *)&parser.pos_);
  pAVar3 = std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
           ::operator->((unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
                         *)&scope.out_);
  (*pAVar3->_vptr_ASTNodeBasic[5])(pAVar3,&ex,&parser.pos_);
  vpl::Scope::~Scope((Scope *)&ex);
  std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>::
  ~unique_ptr((unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
               *)&scope.out_);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  VPLGrammar::Parser::~Parser((Parser *)&expr);
  std::ofstream::~ofstream(&parser.pos_);
  std::__cxx11::string::~string(local_290);
  std::__cxx11::string::~string(local_38);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
    std::string expression;

    if (argc > 1 && std::strcmp(argv[1], "-") != 0) {
        std::ifstream fin(argv[1]);
        expression.assign((std::istreambuf_iterator<char>(fin)), (std::istreambuf_iterator<char>()));
    } else {
        std::getline(std::cin, expression);
    }
    std::cerr << "Input:\n" << expression << std::endl;

    std::string out_fname = argv[1];
    out_fname += ".vasm";
    std::ofstream asm_out(out_fname);

    VPLGrammar::Parser parser;
    try {
        auto expr = parser.Parse(expression);
        expr->Print(std::cout);
        std::cout << std::endl;

        vpl::Scope scope(asm_out);
        expr->BuildProgram(&scope, asm_out);
    } catch (std::exception& ex) {
        std::cout << ex.what();
    }
    std::cout << std::endl;
    return 0;
}